

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

uint32_t cfd::core::Serializer::GetVariableIntSize(uint64_t value)

{
  uint32_t uVar1;
  
  uVar1 = 1;
  if ((0xfc < value) && (uVar1 = 3, 0xffff < value)) {
    uVar1 = (uint)(value >> 0x20 != 0) * 4 + 5;
  }
  return uVar1;
}

Assistant:

uint32_t Serializer::GetVariableIntSize(uint64_t value) {
  if (value <= kViMax8)
    return 1;
  else if (value <= std::numeric_limits<uint16_t>::max())
    return 3;
  else if (value <= std::numeric_limits<uint32_t>::max())
    return 5;
  else
    return 9;
}